

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

char * spvGeneratorStr(uint32_t generator)

{
  undefined4 *puVar1;
  undefined *puVar2;
  
  puVar2 = (undefined *)0x0;
  puVar1 = &(anonymous_namespace)::vendor_tools;
  do {
    if (puVar2 == (undefined *)0x580) {
      if (2 < generator - 0x2c) {
        return "Unknown";
      }
      puVar2 = &DAT_007bc0f4;
      puVar1 = (undefined4 *)(long)*(int *)(&DAT_007bc0f4 + (ulong)(generator - 0x2c) * 4);
LAB_00513a58:
      puVar2 = (undefined *)((long)puVar1 + (long)puVar2);
LAB_00513a5b:
      return *(char **)(puVar2 + 0x18);
    }
    if (*(uint32_t *)((long)&(anonymous_namespace)::vendor_tools + (long)puVar2) == generator)
    goto LAB_00513a58;
    if (*(uint32_t *)((long)&DAT_00a84cc0 + (long)puVar2) == generator) {
      puVar2 = puVar2 + 0x20;
      goto LAB_00513a58;
    }
    if (*(uint32_t *)((long)&DAT_00a84ce0 + (long)puVar2) == generator) {
      puVar2 = puVar2 + 0x40;
      goto LAB_00513a58;
    }
    if (*(uint32_t *)((long)&DAT_00a84d00 + (long)puVar2) == generator) {
      if (puVar2 == (undefined *)0x580) {
        return "Unknown";
      }
      puVar2 = (undefined *)((long)&DAT_00a84d00 + (long)puVar2);
      goto LAB_00513a5b;
    }
    puVar2 = puVar2 + 0x80;
  } while( true );
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}